

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

void __thiscall
Model_replaceImportedUnitsByName_Test::~Model_replaceImportedUnitsByName_Test
          (Model_replaceImportedUnitsByName_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Model, replaceImportedUnitsByName)
{
    auto model = libcellml::Model::create();
    auto myConcreteUnits1 = libcellml::Units::create("myConcreteUnits1");
    auto myImportedUnits1 = libcellml::Units::create("myImportedUnits1");
    auto myConcreteUnits2 = libcellml::Units::create("myConcreteUnits2");
    auto myImportedUnits2 = libcellml::Units::create("myImportedUnits2");

    auto import1 = libcellml::ImportSource::create();
    auto import2 = libcellml::ImportSource::create();

    import1->setUrl("import1.cellml");
    import2->setUrl("import2.cellml");

    myImportedUnits1->setImportSource(import1);
    myImportedUnits2->setImportSource(import2);

    model->addUnits(myConcreteUnits1);
    model->addUnits(myImportedUnits2);

    EXPECT_EQ(size_t(2), model->unitsCount());

    // REPLACE concrete -> imported by name.
    EXPECT_TRUE(model->replaceUnits("myConcreteUnits1", myImportedUnits1));
    EXPECT_EQ(size_t(2), model->unitsCount());

    // REPLACE imported -> concrete by name.
    EXPECT_TRUE(model->replaceUnits("myImportedUnits2", myConcreteUnits2));
    EXPECT_EQ(size_t(2), model->unitsCount());
}